

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

void int_tcfg_get(char *key,TRUN_ConfigItem *outValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  Config *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (outValue != (TRUN_ConfigItem *)0x0 && key != (char *)0x0) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"continue_on_assert","");
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_48,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      outValue->isValid = true;
      strncpy(outValue->name,key,0x1f);
      outValue->value_type = kTRCfgType_Bool;
      pCVar4 = trun::Config::Instance();
      uVar3 = (uint)pCVar4->continueOnAssert;
    }
    else {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"enableThreadTestExecution","");
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_48,key);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 != 0) {
        return;
      }
      outValue->isValid = true;
      builtin_strncpy(outValue->name,"enableThreadTestExecution",0x1a);
      outValue->name[0x1a] = '\0';
      outValue->name[0x1b] = '\0';
      outValue->name[0x1c] = '\0';
      outValue->name[0x1d] = '\0';
      outValue->name[0x1e] = '\0';
      outValue->value_type = kTRCfgType_Bool;
      uVar3 = 1;
    }
    (outValue->value).boolean = uVar3;
  }
  return;
}

Assistant:

static void int_tcfg_get(const char *key, TRUN_ConfigItem *outValue) {
    if (key == nullptr) {
        return;
    }
    if (outValue == nullptr) {
        return;
    }
    // test test
    if (key == std::string("continue_on_assert")) {
        outValue->isValid = true;
        strncpy(outValue->name, key, TR_CFG_ITEM_NAME_LEN-1);
        outValue->value_type = kTRCfgType_Bool;
        outValue->value.boolean = Config::Instance().continueOnAssert;
        return;
    }


    // TODO: Implement properly...
    if (key != std::string("enableThreadTestExecution")) {
        return;
    }
    outValue->isValid = true;
    strncpy(outValue->name,  "enableThreadTestExecution", TR_CFG_ITEM_NAME_LEN-1);
    outValue->value_type = kTRCfgType_Bool;
//    outValue->value.boolean = Config::Instance().enableThreadTestExecution;
    outValue->value.boolean = true;
}